

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.cc
# Opt level: O0

void absl::cord_internal::CordRep::Destroy(CordRep *rep)

{
  bool bVar1;
  CordRepBtree *tree;
  CordRepSubstring *pCVar2;
  CordRepCrc *node;
  CordRepSubstring *rep_substring;
  CordRep *rep_local;
  
  rep_substring = (CordRepSubstring *)rep;
  if (rep == (CordRep *)0x0) {
    __assert_fail("rep != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.cc"
                  ,0x28,"static void absl::cord_internal::CordRep::Destroy(CordRep *)");
  }
  while( true ) {
    bVar1 = RefcountAndFlags::IsImmortal(&(rep_substring->super_CordRep).refcount);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!rep->refcount.IsImmortal()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.cc"
                    ,0x2b,"static void absl::cord_internal::CordRep::Destroy(CordRep *)");
    }
    if ((rep_substring->super_CordRep).tag == '\x03') {
      tree = btree(&rep_substring->super_CordRep);
      CordRepBtree::Destroy(tree);
      return;
    }
    if ((rep_substring->super_CordRep).tag == '\x05') {
      CordRepExternal::Delete(&rep_substring->super_CordRep);
      return;
    }
    if ((rep_substring->super_CordRep).tag != '\x01') break;
    pCVar2 = substring(&rep_substring->super_CordRep);
    rep_substring = (CordRepSubstring *)pCVar2->child;
    if (pCVar2 != (CordRepSubstring *)0x0) {
      operator_delete(pCVar2,0x20);
    }
    bVar1 = RefcountAndFlags::Decrement(&(rep_substring->super_CordRep).refcount);
    if (bVar1) {
      return;
    }
  }
  if ((rep_substring->super_CordRep).tag == '\x02') {
    node = crc(&rep_substring->super_CordRep);
    CordRepCrc::Destroy(node);
    return;
  }
  bVar1 = IsFlat(&rep_substring->super_CordRep);
  if (bVar1) {
    CordRepFlat::Delete(&rep_substring->super_CordRep);
    return;
  }
  __assert_fail("rep->IsFlat()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O0/_deps/abseil-cpp-src/absl/strings/internal/cord_internal.cc"
                ,0x3d,"static void absl::cord_internal::CordRep::Destroy(CordRep *)");
}

Assistant:

void CordRep::Destroy(CordRep* rep) {
  assert(rep != nullptr);

  while (true) {
    assert(!rep->refcount.IsImmortal());
    if (rep->tag == BTREE) {
      CordRepBtree::Destroy(rep->btree());
      return;
    } else if (rep->tag == EXTERNAL) {
      CordRepExternal::Delete(rep);
      return;
    } else if (rep->tag == SUBSTRING) {
      CordRepSubstring* rep_substring = rep->substring();
      rep = rep_substring->child;
      delete rep_substring;
      if (rep->refcount.Decrement()) {
        return;
      }
    } else if (rep->tag == CRC) {
      CordRepCrc::Destroy(rep->crc());
      return;
    } else {
      assert(rep->IsFlat());
      CordRepFlat::Delete(rep);
      return;
    }
  }
}